

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void Am_Get_Selection_In_Display_Order
               (Am_Object *selection_widget,Am_Value_List *selected_objs,Am_Object *group)

{
  Am_Value *pAVar1;
  Am_Value_List unsorted_sel_objs;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Value_List local_38;
  Am_Value_List local_28;
  
  Am_Value_List::Am_Value_List(&local_48);
  pAVar1 = Am_Object::Get(selection_widget,0x169,0);
  Am_Value_List::operator=(&local_48,pAVar1);
  pAVar1 = Am_Object::Get(selection_widget,0x193,0);
  Am_Object::operator=(group,pAVar1);
  Am_Value_List::Am_Value_List(&local_38,&local_48);
  Am_Object::Am_Object(&local_50,group);
  Am_Sort_Obs_In_Group(&local_28,(Am_Object *)&local_38);
  Am_Value_List::operator=(selected_objs,&local_28);
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(&local_38);
  Am_Value_List::~Am_Value_List(&local_48);
  return;
}

Assistant:

void
Am_Get_Selection_In_Display_Order(Am_Object selection_widget,
                                  Am_Value_List &selected_objs,
                                  Am_Object &group)
{
  Am_Value_List unsorted_sel_objs;
  unsorted_sel_objs = selection_widget.Get(Am_VALUE);
  group = selection_widget.Get(Am_OPERATES_ON);
  selected_objs = Am_Sort_Obs_In_Group(unsorted_sel_objs, group);
}